

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void chrono::turtlebot::AddRevoluteJoint
               (shared_ptr<chrono::ChBodyEasyBox> *body_1,shared_ptr<chrono::ChBodyAuxRef> *body_2,
               shared_ptr<chrono::ChBodyAuxRef> *chassis,ChSystem *system,
               ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot)

{
  ChFrame<double> *this;
  element_type *peVar1;
  ChFrame<double> *this_00;
  element_type *peVar2;
  ChCoordsys<double> *mv;
  ChCoordsys<double> *pCVar3;
  shared_ptr<chrono::ChLinkBase> local_1d8;
  ChCoordsys<double> local_1c8;
  shared_ptr<chrono::ChBody> local_190;
  shared_ptr<chrono::ChBody> local_180;
  undefined1 local_170 [8];
  shared_ptr<chrono::ChLinkLockRevolute> revo;
  undefined1 local_150 [8];
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  ChFrame<double> *X_GP;
  ChQuaternion<double> *rel_joint_rot_local;
  ChVector<double> *rel_joint_pos_local;
  ChSystem *system_local;
  shared_ptr<chrono::ChBodyAuxRef> *chassis_local;
  shared_ptr<chrono::ChBodyAuxRef> *body_2_local;
  shared_ptr<chrono::ChBodyEasyBox> *body_1_local;
  
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  this = (ChFrame<double> *)
         ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x40);
  ChFrame<double>::ChFrame(this,rel_joint_pos,rel_joint_rot);
  ChFrame<double>::operator*((ChFrame<double> *)local_150,this_00,this);
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  peVar2 = std::
           __shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_170);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyEasyBox,void>(&local_180,body_1);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_190,body_2);
  mv = ChFrame<double>::GetCoord((ChFrame<double> *)local_150);
  pCVar3 = ChFrame<double>::GetCoord((ChFrame<double> *)local_150);
  ChCoordsys<double>::ChCoordsys(&local_1c8,&mv->pos,&pCVar3->rot);
  (**(code **)(*(long *)peVar2 + 0x250))(peVar2,&local_180,&local_190,&local_1c8);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_190);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_180);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkLockRevolute,void>
            (&local_1d8,(shared_ptr<chrono::ChLinkLockRevolute> *)local_170);
  (**(code **)(*(long *)system + 0x138))(system,&local_1d8);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_1d8);
  std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr
            ((shared_ptr<chrono::ChLinkLockRevolute> *)local_170);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_150);
  ChFrame<double>::~ChFrame
            ((ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  return;
}

Assistant:

void AddRevoluteJoint(std::shared_ptr<ChBodyEasyBox> body_1,
                      std::shared_ptr<ChBodyAuxRef> body_2,
                      std::shared_ptr<ChBodyAuxRef> chassis,
                      ChSystem* system,
                      const ChVector<>& rel_joint_pos,
                      const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto revo = chrono_types::make_shared<ChLinkLockRevolute>();
    revo->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(revo);
}